

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountAggregate.cpp
# Opt level: O1

void __thiscall
CountAggregate::CountAggregate
          (CountAggregate *this,string *pathToFiles,shared_ptr<Launcher> *launcher)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  long *plVar7;
  ulong uVar8;
  long *plVar9;
  long lVar10;
  ulong __val;
  uint __len;
  ulong uVar11;
  string __str;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  long local_98;
  long lStack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  string *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (this->super_MachineLearningModel)._vptr_MachineLearningModel =
       (_func_int **)&PTR__CountAggregate_00144b70;
  paVar1 = &(this->_pathToFiles).field_2;
  (this->_pathToFiles)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (pathToFiles->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_pathToFiles,pcVar2,pcVar2 + pathToFiles->_M_string_length);
  (this->_launcher).super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (launcher->super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (launcher->super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->_launcher).super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (this->_fade).super___shared_ptr<Fade,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  this->_features = (int **)0x0;
  (this->_fade).super___shared_ptr<Fade,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->_fadeAggregates).determinantValueSet =
       (set<double,_std::less<double>,_std::allocator<double>_> *)0x0;
  this->_cofactorMatrix = (ResultType *)0x0;
  (this->_fadeAggregates).categoricalAggregates.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_fadeAggregates).functionalDependencies =
       (map<double,_std::set<double,_std::less<double>,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>_>
        *)0x0;
  (this->_fadeAggregates).categoricalAggregates.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_fadeAggregates).categoricalAggregates.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_fadeAggregates).aggregates = (DataType *)0x0;
  (this->_fadeAggregates).categoricalOffsets = (int *)0x0;
  (this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_aggregateRegister).
  super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_aggregateRegister).
  super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_aggregateRegister).
  super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_lineageRegister).
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_lineageRegister).
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_lineageRegister).
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->onehotfeatures = (bool *)0x0;
  this->isDetermined = (bool *)0x0;
  this->determinedBy = (int *)0x0;
  local_80 = paVar1;
  local_78 = &this->_pathToFiles;
  Launcher::getDTree((launcher->super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  p_Var3 = (this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_a8;
  (this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_a0;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  lVar6 = std::chrono::_V2::system_clock::now();
  createAggregateRegister(this);
  lVar10 = SUB168(SEXT816(lVar6) * SEXT816(-0x431bde82d7b634db),8);
  lVar6 = std::chrono::_V2::system_clock::now();
  uVar11 = lVar6 / 1000000 + ((lVar10 >> 0x12) - (lVar10 >> 0x3f));
  __val = -uVar11;
  if (0 < (long)uVar11) {
    __val = uVar11;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = __val;
    uVar5 = 4;
    do {
      __len = uVar5;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_0012a8ed;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_0012a8ed;
      }
      if (uVar8 < 10000) goto LAB_0012a8ed;
      bVar4 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      uVar5 = __len + 4;
    } while (bVar4);
    __len = __len + 1;
  }
LAB_0012a8ed:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((long)uVar11 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_50[0] + -((long)uVar11 >> 0x3f),__len,__val);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1395b7);
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_60 = *plVar9;
    lStack_58 = plVar7[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar9;
    local_70 = (long *)*plVar7;
  }
  local_68 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_98 = *plVar9;
    lStack_90 = plVar7[3];
    local_a8 = (element_type *)&local_98;
  }
  else {
    local_98 = *plVar9;
    local_a8 = (element_type *)*plVar7;
  }
  lVar6 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)local_a8,lVar6);
  if (local_a8 != (element_type *)&local_98) {
    operator_delete(local_a8);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return;
}

Assistant:

CountAggregate::CountAggregate(
    const string& pathToFiles, shared_ptr<Launcher> launcher) :
    _pathToFiles(pathToFiles), _launcher(launcher)
{
    _dTree = launcher->getDTree();

#ifdef BENCH
    int64_t startPrecompute = duration_cast<milliseconds>(
        system_clock::now().time_since_epoch()).count();
#endif

    /* creates the aggregate Register that is passed to FADE. */
    createAggregateRegister();
    
#ifdef BENCH
    int64_t endPrecompute = duration_cast<milliseconds>
        (system_clock::now().time_since_epoch()).count() - startPrecompute;    
#endif
    
    BINFO( "TIME - Count precomputation: "
           + to_string(endPrecompute) + "ms.\n");
}